

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostream-test.c++
# Opt level: O2

void __thiscall kj::std::anon_unknown_0::TestCase56::run(TestCase56 *this)

{
  int iVar1;
  StdOutputStream out;
  StdInputStream in;
  char buf [9];
  stringstream ss;
  ostream local_180 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  in.super_InputStream._vptr_InputStream = (_func_int **)&PTR__BufferedInputStream_001c80e0;
  out.stream_ = local_180;
  out.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR__ArrayOutputStream_001c8128;
  in.stream_ = (istream *)&ss;
  ::std::ostream::write((char *)out.stream_,0x189806);
  ::std::istream::read((char *)&ss,(long)buf);
  buf[6] = '\0';
  iVar1 = bcmp("foobar",&buf,7);
  if ((iVar1 != 0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[46],char_const(&)[7],char(&)[9]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/std/iostream-test.c++"
               ,0x48,ERROR,
               "\"failed: expected \" \"::strcmp(\\\"foobar\\\", buf) == 0\", \"foobar\", buf",
               (char (*) [46])"failed: expected ::strcmp(\"foobar\", buf) == 0",
               (char (*) [7])"foobar",&buf);
  }
  ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)&out);
  BufferedInputStream::~BufferedInputStream((BufferedInputStream *)&in);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

TEST(StdIoStream, TryReadToEndOfFile) {
  // Check that tryRead works when eof is reached before minBytes.

  ::std::stringstream ss;

  StdInputStream in(ss);
  StdOutputStream out(ss);

  const void* bytes = "foobar";

  out.write(bytes, 6);

  char buf[9];
  in.tryRead(buf, 8, 8);
  buf[6] = '\0';

  EXPECT_STREQ("foobar", buf);
}